

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-test-part.cc
# Opt level: O3

String __thiscall testing::TestPartResult::ExtractSummary(TestPartResult *this,char *message)

{
  char *pcVar1;
  void *__dest;
  size_t extraout_RDX;
  size_t extraout_RDX_00;
  size_t sVar2;
  String SVar3;
  
  pcVar1 = strstr(message,"\nStack trace:\n");
  if (pcVar1 == (char *)0x0) {
    internal::String::String((String *)this,message);
    sVar2 = extraout_RDX_00;
  }
  else {
    pcVar1 = pcVar1 + -(long)message;
    __dest = operator_new__((ulong)(pcVar1 + 1));
    memcpy(__dest,message,(size_t)pcVar1);
    *(char *)((long)__dest + (long)pcVar1) = '\0';
    *(void **)this = __dest;
    (this->file_name_).c_str_ = pcVar1;
    sVar2 = extraout_RDX;
  }
  SVar3.length_ = sVar2;
  SVar3.c_str_ = (char *)this;
  return SVar3;
}

Assistant:

internal::String TestPartResult::ExtractSummary(const char* message) {
  const char* const stack_trace = strstr(message, internal::kStackTraceMarker);
  return stack_trace == NULL ? internal::String(message) :
      internal::String(message, stack_trace - message);
}